

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdHashMessageByText_Test::TestBody(cfdcapi_common_CfdHashMessageByText_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *message;
  char *output;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffffd08;
  AssertionResult *in_stack_fffffffffffffd10;
  CfdErrorCode *in_stack_fffffffffffffd18;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  void **in_stack_fffffffffffffd28;
  AssertHelper local_1f0;
  Message local_1e8;
  undefined4 local_1dc;
  AssertionResult local_1d8;
  AssertHelper local_1c8;
  Message local_1c0;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffedf;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffee0;
  AssertHelper in_stack_fffffffffffffee8;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  AssertHelper local_f0;
  Message local_e8;
  AssertionResult local_e0;
  AssertHelper local_d0;
  Message local_c8;
  undefined4 local_bc;
  AssertionResult local_b8;
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffffd28);
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3361aa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2b9,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x33620d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x336262);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,(type *)0x336296);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2ba,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x336392);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x33640d);
  local_a0 = (char *)0x0;
  local_a8 = "The quick brown fox jumps over the lazy dog";
  local_14 = CfdRipemd160(in_stack_fffffffffffffee8.data_,(char *)in_stack_fffffffffffffee0.ptr_,
                          (bool)in_stack_fffffffffffffedf,(char **)in_stack_fffffffffffffed0.ptr_);
  local_bc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3364fe);
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2c0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::Message::~Message((Message *)0x336561);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3365b6);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_e0,"\"37f332f68db77bd9d7edd4969571ad671cf9dd3b\"","output",
               "37f332f68db77bd9d7edd4969571ad671cf9dd3b",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336665);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x2c2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message((Message *)0x3366c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x33671d);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdSha256(in_stack_fffffffffffffee8.data_,(char *)in_stack_fffffffffffffee0.ptr_,
                       (bool)in_stack_fffffffffffffedf,(char **)in_stack_fffffffffffffed0.ptr_);
  local_104 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x33680e);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffee8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2c8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffee8,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffee8);
    testing::Message::~Message((Message *)0x336871);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3368c6);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffed8,
               "\"d7a8fbb307d7809469ca9abcb0082e4f8d5651e46d3cdb762d02d0bf37c9e592\"","output",
               "d7a8fbb307d7809469ca9abcb0082e4f8d5651e46d3cdb762d02d0bf37c9e592",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffed8);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffed0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336975);
      testing::internal::AssertHelper::AssertHelper
                (&local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x2ca,pcVar2);
      testing::internal::AssertHelper::operator=(&local_138,(Message *)&stack0xfffffffffffffed0);
      testing::internal::AssertHelper::~AssertHelper(&local_138);
      testing::Message::~Message((Message *)0x3369d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336a2d);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdHash160(in_stack_fffffffffffffee8.data_,(char *)in_stack_fffffffffffffee0.ptr_,
                        (bool)in_stack_fffffffffffffedf,(char **)in_stack_fffffffffffffed0.ptr_);
  local_14c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336b12);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2d0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x336b6f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x336bc4);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_170,"\"0e3397b4abc7a382b3ea2365883c3c7ca5f07600\"","output",
               "0e3397b4abc7a382b3ea2365883c3c7ca5f07600",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
    if (!bVar1) {
      testing::Message::Message(&local_178);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336c67);
      testing::internal::AssertHelper::AssertHelper
                (&local_180,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x2d2,pcVar2);
      testing::internal::AssertHelper::operator=(&local_180,&local_178);
      testing::internal::AssertHelper::~AssertHelper(&local_180);
      testing::Message::~Message((Message *)0x336cc4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x336d19);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdHash256(in_stack_fffffffffffffee8.data_,(char *)in_stack_fffffffffffffee0.ptr_,
                        (bool)in_stack_fffffffffffffedf,(char **)in_stack_fffffffffffffed0.ptr_);
  local_194 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x336dfe);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2d8,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    testing::Message::~Message((Message *)0x336e5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x336eb0);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_1b8,
               "\"6d37795021e544d82b41850edf7aabab9a0ebe274e54a519840c4666f35b3937\"","output",
               "6d37795021e544d82b41850edf7aabab9a0ebe274e54a519840c4666f35b3937",local_a0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      in_stack_fffffffffffffd28 =
           (void **)testing::AssertionResult::failure_message((AssertionResult *)0x336f53);
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
                 ,0x2da,(char *)in_stack_fffffffffffffd28);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      testing::Message::~Message((Message *)0x336fb0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x337005);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffd18);
    local_a0 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffd18);
  local_1dc = 0;
  this_00 = &local_1d8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffd28,
             (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             (CfdErrorCode *)this_00,(int *)in_stack_fffffffffffffd10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3370d5);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x2e0,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message((Message *)0x337132);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x337187);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdHashMessageByText) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* output = nullptr;
  const char* message = "The quick brown fox jumps over the lazy dog";

  ret = CfdRipemd160(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("37f332f68db77bd9d7edd4969571ad671cf9dd3b", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdSha256(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("d7a8fbb307d7809469ca9abcb0082e4f8d5651e46d3cdb762d02d0bf37c9e592", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdHash160(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0e3397b4abc7a382b3ea2365883c3c7ca5f07600", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdHash256(handle, message, true, &output);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("6d37795021e544d82b41850edf7aabab9a0ebe274e54a519840c4666f35b3937", output);
    CfdFreeStringBuffer(output);
    output = nullptr;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}